

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O0

void soul::HEARTGenerator::build
               (ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> sourceModules,
               ArrayView<soul::pool_ref<soul::Module>_> targetModules,
               uint32_t maxNestedExpressionDepth)

{
  ulong uVar1;
  pool_ref<soul::AST::ModuleBase> *ppVar2;
  ModuleBase *pMVar3;
  size_t sVar4;
  pool_ref *ppVar5;
  Module *targetModule;
  reference pvVar6;
  ulong local_108;
  size_t i_1;
  HEARTGenerator local_f0;
  ulong local_70;
  size_t i;
  vector<soul::HEARTGenerator,_std::allocator<soul::HEARTGenerator>_> generators;
  pool_ref<soul::AST::ModuleBase> *m;
  pool_ref<soul::AST::ModuleBase> *__end2;
  pool_ref<soul::AST::ModuleBase> *__begin2;
  ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> *__range2;
  undefined1 auStack_28 [4];
  uint32_t maxNestedExpressionDepth_local;
  ArrayView<soul::pool_ref<soul::Module>_> targetModules_local;
  ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> sourceModules_local;
  
  targetModules_local.e = (pool_ref<soul::Module> *)sourceModules.s;
  targetModules_local.s = targetModules.e;
  _auStack_28 = targetModules.s;
  __end2 = ArrayView<soul::pool_ref<soul::AST::ModuleBase>_>::begin
                     ((ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> *)&targetModules_local.e);
  ppVar2 = ArrayView<soul::pool_ref<soul::AST::ModuleBase>_>::end
                     ((ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> *)&targetModules_local.e);
  for (; __end2 != ppVar2; __end2 = __end2 + 1) {
    generators.super__Vector_base<soul::HEARTGenerator,_std::allocator<soul::HEARTGenerator>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)__end2;
    pMVar3 = pool_ref::operator_cast_to_ModuleBase_((pool_ref *)__end2);
    SanityCheckPass::runPreHEARTGenChecks(pMVar3);
  }
  std::vector<soul::HEARTGenerator,_std::allocator<soul::HEARTGenerator>_>::vector
            ((vector<soul::HEARTGenerator,_std::allocator<soul::HEARTGenerator>_> *)&i);
  local_70 = 0;
  while( true ) {
    uVar1 = local_70;
    sVar4 = ArrayView<soul::pool_ref<soul::AST::ModuleBase>_>::size
                      ((ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> *)&targetModules_local.e);
    if (sVar4 <= uVar1) break;
    ppVar5 = (pool_ref *)
             ArrayView<soul::pool_ref<soul::AST::ModuleBase>_>::operator[]
                       ((ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> *)&targetModules_local.e,
                        local_70);
    pMVar3 = pool_ref::operator_cast_to_ModuleBase_(ppVar5);
    ppVar5 = (pool_ref *)
             ArrayView<soul::pool_ref<soul::Module>_>::operator[]
                       ((ArrayView<soul::pool_ref<soul::Module>_> *)auStack_28,local_70);
    targetModule = pool_ref::operator_cast_to_Module_(ppVar5);
    HEARTGenerator(&local_f0,pMVar3,targetModule,maxNestedExpressionDepth);
    std::vector<soul::HEARTGenerator,_std::allocator<soul::HEARTGenerator>_>::push_back
              ((vector<soul::HEARTGenerator,_std::allocator<soul::HEARTGenerator>_> *)&i,&local_f0);
    ~HEARTGenerator(&local_f0);
    local_70 = local_70 + 1;
  }
  local_108 = 0;
  while( true ) {
    sVar4 = ArrayView<soul::pool_ref<soul::AST::ModuleBase>_>::size
                      ((ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> *)&targetModules_local.e);
    if (sVar4 <= local_108) break;
    pvVar6 = std::vector<soul::HEARTGenerator,_std::allocator<soul::HEARTGenerator>_>::operator[]
                       ((vector<soul::HEARTGenerator,_std::allocator<soul::HEARTGenerator>_> *)&i,
                        local_108);
    ppVar5 = (pool_ref *)
             ArrayView<soul::pool_ref<soul::AST::ModuleBase>_>::operator[]
                       ((ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> *)&targetModules_local.e,
                        local_108);
    pMVar3 = pool_ref::operator_cast_to_ModuleBase_(ppVar5);
    (*(pvVar6->super_ASTVisitor)._vptr_ASTVisitor[2])(pvVar6,pMVar3);
    local_108 = local_108 + 1;
  }
  std::vector<soul::HEARTGenerator,_std::allocator<soul::HEARTGenerator>_>::~vector
            ((vector<soul::HEARTGenerator,_std::allocator<soul::HEARTGenerator>_> *)&i);
  return;
}

Assistant:

static void build (ArrayView<pool_ref<AST::ModuleBase>> sourceModules,
                       ArrayView<pool_ref<Module>> targetModules,
                       uint32_t maxNestedExpressionDepth = 255)
    {
        for (auto& m : sourceModules)
            SanityCheckPass::runPreHEARTGenChecks (m);

        std::vector<HEARTGenerator> generators;

        for (size_t i = 0; i < sourceModules.size(); ++i)
            generators.push_back ({ sourceModules[i], targetModules[i], maxNestedExpressionDepth });

        for (size_t i = 0; i < sourceModules.size(); ++i)
            generators[i].visitObject (sourceModules[i]);
    }